

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O3

string * duckdb::StrTimeFormat::ParseFormatSpecifier
                   (string *__return_storage_ptr__,string *format_string,StrTimeFormat *format)

{
  byte bVar1;
  pointer pSVar2;
  pointer piVar3;
  long lVar4;
  byte bVar5;
  reference pvVar6;
  reference pvVar7;
  long *plVar8;
  InternalException *this;
  ulong uVar9;
  char *pcVar10;
  size_type *psVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong uVar13;
  pointer pcVar14;
  ulong uVar15;
  ulong uVar16;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  size_type __n;
  string current_literal;
  string subformat;
  StrfTimeFormat locale_format;
  string error;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  char *local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  string *local_1f8;
  string local_1f0;
  string local_1d0;
  size_type *local_1b0;
  size_type local_1a8;
  size_type local_1a0;
  undefined8 uStack_198;
  undefined1 local_190 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  vector<duckdb::StrTimeSpecifier,_true> local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  vStack_150;
  idx_t local_138;
  pointer piStack_130;
  pointer local_128;
  pointer piStack_120;
  void *local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  void *pvStack_100;
  undefined4 local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 local_e0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  char *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (format_string->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"Empty format string","");
  }
  else {
    ::std::__cxx11::string::_M_assign((string *)&format->format_specifier);
    pSVar2 = (format->specifiers).
             super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
             super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((format->specifiers).
        super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        _M_impl.super__Vector_impl_data._M_finish != pSVar2) {
      (format->specifiers).
      super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
      super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
      _M_impl.super__Vector_impl_data._M_finish = pSVar2;
    }
    this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&format->literals
    ;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00);
    piVar3 = (format->numeric_width).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((format->numeric_width).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
        piVar3) {
      (format->numeric_width).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           piVar3;
    }
    format->constant_size = 0;
    local_218 = &local_208;
    local_210 = (char *)0x0;
    local_208._M_allocated_capacity._0_4_ = local_208._M_allocated_capacity._0_4_ & 0xffffff00;
    uVar9 = format_string->_M_string_length;
    if (uVar9 != 0) {
      uVar13 = 0;
      uVar16 = 0;
      local_1f8 = __return_storage_ptr__;
      local_d8 = this_00;
      do {
        __return_storage_ptr__ = local_1f8;
        pcVar14 = (format_string->_M_dataplus)._M_p;
        uVar15 = uVar13;
        if (pcVar14[uVar13] == '%') {
          uVar15 = uVar13 + 1;
          if (uVar15 == uVar9) {
            (local_1f8->_M_dataplus)._M_p = (pointer)&local_1f8->field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1f8,"Trailing format character %","");
            goto LAB_014f1bf4;
          }
          if (uVar16 < uVar13) {
            ::std::__cxx11::string::substr((ulong)local_190,(ulong)format_string);
            ::std::__cxx11::string::_M_append((char *)&local_218,local_190._0_8_);
            if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
              operator_delete((void *)local_190._0_8_);
            }
            pcVar14 = (format_string->_M_dataplus)._M_p;
          }
          bVar1 = pcVar14[uVar15];
          switch(bVar1) {
          case 0x41:
            bVar5 = 1;
            break;
          case 0x42:
            bVar5 = 6;
            break;
          case 0x43:
          case 0x44:
          case 0x45:
          case 0x46:
          case 0x4a:
          case 0x4b:
          case 0x4c:
          case 0x4e:
          case 0x4f:
          case 0x50:
          case 0x51:
          case 0x52:
          case 0x5b:
          case 0x5c:
          case 0x5d:
          case 0x5e:
          case 0x5f:
          case 0x60:
          case 0x65:
          case 0x69:
          case 0x6b:
          case 0x6c:
          case 0x6f:
          case 0x71:
          case 0x72:
          case 0x73:
          case 0x74:
          case 0x76:
switchD_014f15ac_caseD_43:
            local_190._0_8_ = local_190 + 0x10;
            ::std::__cxx11::string::_M_construct((ulong)local_190,'\x01');
            plVar8 = (long *)::std::__cxx11::string::replace
                                       ((ulong)local_190,0,(char *)0x0,0x1df5b22);
            (local_1f8->_M_dataplus)._M_p = (pointer)&local_1f8->field_2;
            psVar11 = (size_type *)(plVar8 + 2);
            if ((size_type *)*plVar8 == psVar11) {
              lVar4 = plVar8[3];
              (local_1f8->field_2)._M_allocated_capacity = *psVar11;
              *(long *)((long)&local_1f8->field_2 + 8) = lVar4;
            }
            else {
              (local_1f8->_M_dataplus)._M_p = (pointer)*plVar8;
              (local_1f8->field_2)._M_allocated_capacity = *psVar11;
            }
            local_1f8->_M_string_length = plVar8[1];
            *plVar8 = (long)psVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            __return_storage_ptr__ = local_1f8;
LAB_014f1c99:
            if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
              operator_delete((void *)local_190._0_8_);
            }
            goto LAB_014f1bf4;
          case 0x47:
            bVar5 = 0x21;
            break;
          case 0x48:
            bVar5 = 0xc;
            break;
          case 0x49:
            bVar5 = 0xe;
            break;
          case 0x4d:
            bVar5 = 0x11;
            break;
          case 0x53:
            bVar5 = 0x13;
            break;
          case 0x54:
          case 0x58:
          case 99:
          case 0x78:
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            local_1d0._M_string_length = 0;
            local_1d0.field_2._M_local_buf[0] = '\0';
            if (bVar1 < 99) {
              if ((bVar1 == 0x54) || (bVar1 == 0x58)) {
                pcVar10 = "%H:%M:%S";
                goto LAB_014f1723;
              }
            }
            else {
              if (bVar1 == 0x78) {
                pcVar10 = "%Y-%m-%d";
              }
              else {
                if (bVar1 != 99) goto LAB_014f1731;
                pcVar10 = "%Y-%m-%d %H:%M:%S";
              }
LAB_014f1723:
              ::std::__cxx11::string::_M_replace((ulong)&local_1d0,0,(char *)0x0,(ulong)pcVar10);
            }
LAB_014f1731:
            local_190._8_8_ = &local_178;
            local_190._16_8_ = 0;
            local_178._M_local_buf[0] = '\0';
            local_128 = (pointer)0x0;
            piStack_120 = (pointer)0x0;
            local_138 = 0;
            piStack_130 = (pointer)0x0;
            vStack_150.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            vStack_150.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_168.
            super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
            super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            vStack_150.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_168.
            super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
            super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_168.
            super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
            super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_190._0_8_ = &PTR__StrfTimeFormat_024525b8;
            local_f0 = 0;
            local_e8 = 0;
            local_e0 = 0;
            local_f8 = 0;
            local_108 = 0;
            pvStack_100 = (void *)0x0;
            local_118 = (void *)0x0;
            uStack_110 = 0;
            ParseFormatSpecifier(&local_b0,&local_1d0,(StrTimeFormat *)local_190);
            if (local_b0._M_string_length != 0) {
              this = (InternalException *)__cxa_allocate_exception(0x10);
              local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1f0,"Failed to bind sub-format specifier \"%s\": %s","");
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,local_1d0._M_dataplus._M_p,
                         local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_70,local_b0._M_dataplus._M_p,
                         local_b0._M_dataplus._M_p + local_b0._M_string_length);
              InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                        (this,&local_1f0,&local_50,&local_70);
              __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
            }
            pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::operator[](&vStack_150,0);
            plVar8 = (long *)::std::__cxx11::string::_M_append
                                       ((char *)&local_218,(ulong)(pvVar6->_M_dataplus)._M_p);
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            psVar11 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_1f0.field_2._M_allocated_capacity = *psVar11;
              local_1f0.field_2._8_8_ = plVar8[3];
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *psVar11;
              local_1f0._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_1f0._M_string_length = plVar8[1];
            *plVar8 = (long)psVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::operator[](&vStack_150,0);
            ::std::__cxx11::string::operator=((string *)pvVar6,(string *)&local_1f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
            ::std::__cxx11::string::_M_replace((ulong)&local_218,0,local_210,0x1f53803);
            if (local_168.
                super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
                super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_168.
                super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
                super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              __n = 0;
              do {
                pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         ::operator[](&vStack_150,__n);
                local_1b0 = &local_1a0;
                psVar11 = (size_type *)(pvVar6->_M_dataplus)._M_p;
                paVar12 = &pvVar6->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11 == paVar12) {
                  local_1a0 = paVar12->_M_allocated_capacity;
                  uStack_198 = *(undefined8 *)((long)&pvVar6->field_2 + 8);
                }
                else {
                  local_1a0 = paVar12->_M_allocated_capacity;
                  local_1b0 = psVar11;
                }
                local_1a8 = pvVar6->_M_string_length;
                (pvVar6->_M_dataplus)._M_p = (pointer)paVar12;
                pvVar6->_M_string_length = 0;
                (pvVar6->field_2)._M_local_buf[0] = '\0';
                pvVar7 = vector<duckdb::StrTimeSpecifier,_true>::operator[](&local_168,__n);
                (*format->_vptr_StrTimeFormat[2])(format,&local_1b0,(ulong)*pvVar7);
                if (local_1b0 != &local_1a0) {
                  operator_delete(local_1b0);
                }
                __n = __n + 1;
              } while (__n < (ulong)((long)local_168.
                                           super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                                           .
                                           super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_168.
                                          super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                                          .
                                          super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            local_190._0_8_ = &PTR__StrfTimeFormat_024525b8;
            if (pvStack_100 != (void *)0x0) {
              operator_delete(pvStack_100);
              pvStack_100 = (void *)0x0;
              local_f8 = 0;
              local_f0 = 0;
              local_e8 = 0;
              local_e0 = 0;
            }
            if (local_118 != (void *)0x0) {
              operator_delete(local_118);
            }
            ~StrTimeFormat((StrTimeFormat *)local_190);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p);
            }
            uVar16 = uVar13 + 2;
            goto LAB_014f1ab7;
          case 0x55:
            bVar5 = 0x1b;
            break;
          case 0x56:
            bVar5 = 0x23;
            break;
          case 0x57:
            bVar5 = 0x1c;
            break;
          case 0x59:
            bVar5 = 0xb;
            break;
          case 0x5a:
            bVar5 = 0x18;
            break;
          case 0x61:
            bVar5 = 0;
            break;
          case 0x62:
          case 0x68:
            bVar5 = 5;
            break;
          case 100:
            bVar5 = 3;
            break;
          case 0x66:
            bVar5 = 0x15;
            break;
          case 0x67:
            bVar5 = 0x16;
            break;
          case 0x6a:
            bVar5 = 0x19;
            break;
          case 0x6d:
            bVar5 = 7;
            break;
          case 0x6e:
            bVar5 = 0x20;
            break;
          case 0x70:
            bVar5 = 0x10;
            break;
          case 0x75:
            bVar5 = 0x22;
            break;
          case 0x77:
            bVar5 = 2;
            break;
          case 0x79:
            bVar5 = 9;
            break;
          case 0x7a:
            bVar5 = 0x17;
            break;
          default:
            uVar16 = uVar15;
            if (bVar1 == 0x25) goto LAB_014f1ab7;
            if ((bVar1 != 0x2d) || (uVar15 = uVar13 + 2, format_string->_M_string_length <= uVar15))
            goto switchD_014f15ac_caseD_43;
            bVar1 = pcVar14[uVar15];
            if (bVar1 < 100) {
              if (bVar1 < 0x4d) {
                if (bVar1 == 0x48) {
                  bVar5 = 0xd;
                }
                else {
                  if (bVar1 != 0x49) {
LAB_014f1cbc:
                    local_190._0_8_ = local_190 + 0x10;
                    ::std::__cxx11::string::_M_construct((ulong)local_190,'\x01');
                    __return_storage_ptr__ = local_1f8;
                    ::std::operator+(local_1f8,"Unrecognized format for strftime/strptime: %-",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_190);
                    goto LAB_014f1c99;
                  }
                  bVar5 = 0xf;
                }
              }
              else if (bVar1 == 0x4d) {
                bVar5 = 0x12;
              }
              else {
                if (bVar1 != 0x53) goto LAB_014f1cbc;
                bVar5 = 0x14;
              }
            }
            else if (bVar1 < 0x6d) {
              bVar5 = 4;
              if (bVar1 != 100) {
                if (bVar1 != 0x6a) goto LAB_014f1cbc;
                bVar5 = 0x1a;
              }
            }
            else if (bVar1 == 0x79) {
              bVar5 = 10;
            }
            else {
              if (bVar1 != 0x6d) goto LAB_014f1cbc;
              bVar5 = 8;
            }
          }
          if (local_218 == &local_208) {
            local_c0._8_4_ = local_208._8_4_;
            local_c0._12_4_ = local_208._12_4_;
            local_d0 = &local_c0;
          }
          else {
            local_d0 = local_218;
          }
          local_c0._M_allocated_capacity._4_4_ = local_208._M_allocated_capacity._4_4_;
          local_c0._M_allocated_capacity._0_4_ = local_208._M_allocated_capacity._0_4_;
          local_c8 = local_210;
          local_210 = (char *)0x0;
          local_208._M_allocated_capacity._0_4_ = local_208._M_allocated_capacity._0_4_ & 0xffffff00
          ;
          local_218 = &local_208;
          (*format->_vptr_StrTimeFormat[2])(format,&local_d0,(ulong)bVar5);
          if (local_d0 != &local_c0) {
            operator_delete(local_d0);
          }
          ::std::__cxx11::string::_M_replace((ulong)&local_218,0,local_210,0x1f53803);
          uVar16 = uVar15 + 1;
        }
LAB_014f1ab7:
        this_00 = local_d8;
        __return_storage_ptr__ = local_1f8;
        uVar13 = uVar15 + 1;
        uVar9 = format_string->_M_string_length;
      } while (uVar13 < uVar9);
      if (uVar16 < uVar9) {
        ::std::__cxx11::string::substr((ulong)local_190,(ulong)format_string);
        ::std::__cxx11::string::_M_append((char *)&local_218,local_190._0_8_);
        if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
          operator_delete((void *)local_190._0_8_);
        }
      }
    }
    pcVar10 = local_210;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    if (local_218 != &local_208) {
      local_90._M_dataplus._M_p = (pointer)local_218;
    }
    local_90.field_2._M_allocated_capacity._4_4_ = local_208._M_allocated_capacity._4_4_;
    local_90.field_2._M_allocated_capacity._0_4_ = local_208._M_allocated_capacity._0_4_;
    local_90._M_string_length = (size_type)local_210;
    local_210 = (char *)0x0;
    local_208._M_allocated_capacity._0_4_ = local_208._M_allocated_capacity._0_4_ & 0xffffff00;
    format->constant_size = (idx_t)(pcVar10 + format->constant_size);
    local_218 = &local_208;
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(this_00,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_014f1bf4:
    if (local_218 != &local_208) {
      operator_delete(local_218);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string StrTimeFormat::ParseFormatSpecifier(const string &format_string, StrTimeFormat &format) {
	if (format_string.empty()) {
		return "Empty format string";
	}
	format.format_specifier = format_string;
	format.specifiers.clear();
	format.literals.clear();
	format.numeric_width.clear();
	format.constant_size = 0;
	idx_t pos = 0;
	string current_literal;
	for (idx_t i = 0; i < format_string.size(); i++) {
		if (format_string[i] == '%') {
			if (i + 1 == format_string.size()) {
				return "Trailing format character %";
			}
			if (i > pos) {
				// push the previous string to the current literal
				current_literal += format_string.substr(pos, i - pos);
			}
			char format_char = format_string[++i];
			if (format_char == '%') {
				// special case: %%
				// set the pos for the next literal and continue
				pos = i;
				continue;
			}
			StrTimeSpecifier specifier;
			if (format_char == '-' && i + 1 < format_string.size()) {
				format_char = format_string[++i];
				switch (format_char) {
				case 'd':
					specifier = StrTimeSpecifier::DAY_OF_MONTH;
					break;
				case 'm':
					specifier = StrTimeSpecifier::MONTH_DECIMAL;
					break;
				case 'y':
					specifier = StrTimeSpecifier::YEAR_WITHOUT_CENTURY;
					break;
				case 'H':
					specifier = StrTimeSpecifier::HOUR_24_DECIMAL;
					break;
				case 'I':
					specifier = StrTimeSpecifier::HOUR_12_DECIMAL;
					break;
				case 'M':
					specifier = StrTimeSpecifier::MINUTE_DECIMAL;
					break;
				case 'S':
					specifier = StrTimeSpecifier::SECOND_DECIMAL;
					break;
				case 'j':
					specifier = StrTimeSpecifier::DAY_OF_YEAR_DECIMAL;
					break;
				default:
					return "Unrecognized format for strftime/strptime: %-" + string(1, format_char);
				}
			} else {
				switch (format_char) {
				case 'a':
					specifier = StrTimeSpecifier::ABBREVIATED_WEEKDAY_NAME;
					break;
				case 'A':
					specifier = StrTimeSpecifier::FULL_WEEKDAY_NAME;
					break;
				case 'w':
					specifier = StrTimeSpecifier::WEEKDAY_DECIMAL;
					break;
				case 'u':
					specifier = StrTimeSpecifier::WEEKDAY_ISO;
					break;
				case 'd':
					specifier = StrTimeSpecifier::DAY_OF_MONTH_PADDED;
					break;
				case 'h':
				case 'b':
					specifier = StrTimeSpecifier::ABBREVIATED_MONTH_NAME;
					break;
				case 'B':
					specifier = StrTimeSpecifier::FULL_MONTH_NAME;
					break;
				case 'm':
					specifier = StrTimeSpecifier::MONTH_DECIMAL_PADDED;
					break;
				case 'y':
					specifier = StrTimeSpecifier::YEAR_WITHOUT_CENTURY_PADDED;
					break;
				case 'Y':
					specifier = StrTimeSpecifier::YEAR_DECIMAL;
					break;
				case 'G':
					specifier = StrTimeSpecifier::YEAR_ISO;
					break;
				case 'H':
					specifier = StrTimeSpecifier::HOUR_24_PADDED;
					break;
				case 'I':
					specifier = StrTimeSpecifier::HOUR_12_PADDED;
					break;
				case 'p':
					specifier = StrTimeSpecifier::AM_PM;
					break;
				case 'M':
					specifier = StrTimeSpecifier::MINUTE_PADDED;
					break;
				case 'S':
					specifier = StrTimeSpecifier::SECOND_PADDED;
					break;
				case 'n':
					specifier = StrTimeSpecifier::NANOSECOND_PADDED;
					break;
				case 'f':
					specifier = StrTimeSpecifier::MICROSECOND_PADDED;
					break;
				case 'g':
					specifier = StrTimeSpecifier::MILLISECOND_PADDED;
					break;
				case 'z':
					specifier = StrTimeSpecifier::UTC_OFFSET;
					break;
				case 'Z':
					specifier = StrTimeSpecifier::TZ_NAME;
					break;
				case 'j':
					specifier = StrTimeSpecifier::DAY_OF_YEAR_PADDED;
					break;
				case 'U':
					specifier = StrTimeSpecifier::WEEK_NUMBER_PADDED_SUN_FIRST;
					break;
				case 'W':
					specifier = StrTimeSpecifier::WEEK_NUMBER_PADDED_MON_FIRST;
					break;
				case 'V':
					specifier = StrTimeSpecifier::WEEK_NUMBER_ISO;
					break;
				case 'c':
				case 'x':
				case 'X':
				case 'T': {
					string subformat;
					if (format_char == 'c') {
						// %c: Locale’s appropriate date and time representation.
						// we push the ISO timestamp representation here
						subformat = "%Y-%m-%d %H:%M:%S";
					} else if (format_char == 'x') {
						// %x - Locale’s appropriate date representation.
						// we push the ISO date format here
						subformat = "%Y-%m-%d";
					} else if (format_char == 'X' || format_char == 'T') {
						// %X - Locale’s appropriate time representation.
						// we push the ISO time format here
						subformat = "%H:%M:%S";
					}
					// parse the subformat in a separate format specifier
					StrfTimeFormat locale_format;
					string error = StrTimeFormat::ParseFormatSpecifier(subformat, locale_format);
					if (!error.empty()) {
						throw InternalException("Failed to bind sub-format specifier \"%s\": %s", subformat, error);
					}
					// add the previous literal to the first literal of the subformat
					locale_format.literals[0] = std::move(current_literal) + locale_format.literals[0];
					current_literal = "";
					// now push the subformat into the current format specifier
					for (idx_t i = 0; i < locale_format.specifiers.size(); i++) {
						format.AddFormatSpecifier(std::move(locale_format.literals[i]), locale_format.specifiers[i]);
					}
					pos = i + 1;
					continue;
				}
				default:
					return "Unrecognized format for strftime/strptime: %" + string(1, format_char);
				}
			}
			format.AddFormatSpecifier(std::move(current_literal), specifier);
			current_literal = "";
			pos = i + 1;
		}
	}
	// add the final literal
	if (pos < format_string.size()) {
		current_literal += format_string.substr(pos, format_string.size() - pos);
	}
	format.AddLiteral(std::move(current_literal));
	return string();
}